

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O0

bool tinyusdz::tydra::EvaluateTypedAnimatableAttribute<tinyusdz::value::quath>
               (Stage *stage,TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_> *tattr,
               string *attr_name,quath *value_out,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  allocator local_831;
  string local_830 [32];
  fmt local_810 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  string local_7d0;
  allocator local_7a9;
  string local_7a8 [32];
  string local_788;
  quath *local_768;
  quath *pv;
  undefined1 local_758 [7];
  bool ret;
  TerminalAttributeValue value_1;
  Attribute attr;
  string local_258 [32];
  fmt local_238 [36];
  int local_214;
  undefined1 local_210 [8];
  Animatable<tinyusdz::value::quath> value;
  ostringstream local_1c0 [8];
  ostringstream ss_e;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  string *err_local;
  quath *value_out_local;
  string *attr_name_local;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_> *tattr_local;
  Stage *stage_local;
  
  if (value_out == (quath *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c0);
    poVar2 = ::std::operator<<((ostream *)local_1c0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"EvaluateTypedAnimatableAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd4);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1c0,"`value_out` param is nullptr.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&value._ts._dirty);
      ::std::__cxx11::string::~string((string *)&value._ts._dirty);
    }
    stage_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c0);
    goto LAB_00864adb;
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::is_blocked(tattr);
  if (bVar1) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Attribute is Blocked.\n");
    }
    stage_local._7_1_ = 0;
    goto LAB_00864adb;
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::has_value(tattr);
  if (bVar1) {
    Animatable<tinyusdz::value::quath>::Animatable((Animatable<tinyusdz::value::quath> *)local_210);
    bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::get_value
                      (tattr,(Animatable<tinyusdz::value::quath> *)local_210);
    if (bVar1) {
      bVar1 = Animatable<tinyusdz::value::quath>::get
                        ((Animatable<tinyusdz::value::quath> *)local_210,t,value_out,tinterp);
      if (bVar1) {
        stage_local._7_1_ = 1;
        local_214 = 1;
      }
      else {
        if (err != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_258,"Failed to get TypedAnimatableAttribute value: {} \n",
                     (allocator *)
                     ((long)&attr._metas.stringData.
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          fmt::format<std::__cxx11::string>
                    (local_238,(string *)local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name)
          ;
          ::std::__cxx11::string::operator+=((string *)err,(string *)local_238);
          ::std::__cxx11::string::~string((string *)local_238);
          ::std::__cxx11::string::~string(local_258);
          ::std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&attr._metas.stringData.
                             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        }
        stage_local._7_1_ = 0;
        local_214 = 1;
      }
    }
    else {
      local_214 = 0;
    }
    Animatable<tinyusdz::value::quath>::~Animatable((Animatable<tinyusdz::value::quath> *)local_210)
    ;
joined_r0x00864866:
    if (local_214 != 0) goto LAB_00864adb;
  }
  else {
    bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::has_connections(tattr);
    if (bVar1) {
      anon_unknown_2::ToAttributeConnection<tinyusdz::value::quath>
                ((Attribute *)
                 &value_1._meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,tattr);
      TerminalAttributeValue::TerminalAttributeValue((TerminalAttributeValue *)local_758);
      args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
      pv._7_1_ = EvaluateAttribute(stage,(Attribute *)
                                         &value_1._meta.stringData.
                                          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   attr_name,(TerminalAttributeValue *)local_758,err,t,tinterp);
      if ((bool)pv._7_1_) {
        local_768 = TerminalAttributeValue::as<tinyusdz::value::quath>
                              ((TerminalAttributeValue *)local_758);
        if (local_768 == (quath *)0x0) {
          if (err != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_7a8,
                       "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                       ,&local_7a9);
            TerminalAttributeValue::type_name_abi_cxx11_
                      (&local_7d0,(TerminalAttributeValue *)local_758);
            tinyusdz::value::TypeTraits<tinyusdz::value::quath>::type_name_abi_cxx11_();
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&local_788,(fmt *)local_7a8,&local_7d0,&local_7f0,attr_name,args_2);
            ::std::__cxx11::string::operator+=((string *)err,(string *)&local_788);
            ::std::__cxx11::string::~string((string *)&local_788);
            ::std::__cxx11::string::~string((string *)&local_7f0);
            ::std::__cxx11::string::~string((string *)&local_7d0);
            ::std::__cxx11::string::~string(local_7a8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
          }
          local_214 = 0;
        }
        else {
          *value_out = *local_768;
          stage_local._7_1_ = 1;
          local_214 = 1;
        }
      }
      else {
        stage_local._7_1_ = 0;
        local_214 = 1;
      }
      TerminalAttributeValue::~TerminalAttributeValue((TerminalAttributeValue *)local_758);
      Attribute::~Attribute
                ((Attribute *)
                 &value_1._meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      goto joined_r0x00864866;
    }
    bVar1 = TypedAttribute<tinyusdz::Animatable<tinyusdz::value::quath>_>::is_value_empty(tattr);
    if (bVar1) {
      if (err != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)err,"Attribute value is empty.\n");
      }
      stage_local._7_1_ = 0;
      goto LAB_00864adb;
    }
    if (err != (string *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_830,"[Internal error] Invalid TypedAttribute? : {} \n",&local_831);
      fmt::format<std::__cxx11::string>
                (local_810,(string *)local_830,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)attr_name);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_810);
      ::std::__cxx11::string::~string((string *)local_810);
      ::std::__cxx11::string::~string(local_830);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_831);
    }
  }
  stage_local._7_1_ = 0;
LAB_00864adb:
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}